

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupFlopsOnly(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *p_01;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  p_01 = Aig_ManDupWithoutPos(p);
  for (local_24 = 0; iVar1 = Saig_ManRegNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
    pAVar2 = Aig_ObjChild0Copy(pObj_00);
    pAVar2 = Aig_ObjCreateCo(p_01,pAVar2);
    (pObj_00->field_5).pData = pAVar2;
  }
  Aig_ManCleanup(p_01);
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_01,iVar1);
  iVar1 = Aig_ManCheck(p_01);
  if (iVar1 == 0) {
    printf("Aig_ManDupFlopsOnly(): The check has failed.\n");
  }
  return p_01;
}

Assistant:

Aig_Man_t * Aig_ManDupFlopsOnly( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManDupWithoutPos( p );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupFlopsOnly(): The check has failed.\n" );
    return pNew;

}